

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleAttenNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  int iVar1;
  Property *pPVar2;
  Value *this_00;
  char *__s2;
  float fVar3;
  string local_40;
  
  if (node != (DDLNode *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"curve","");
    pPVar2 = ODDLParser::DDLNode::findPropertyByName(node,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((pPVar2 != (Property *)0x0) && (pPVar2->m_value != (Value *)0x0)) {
      this_00 = ODDLParser::DDLNode::getValue(node);
      fVar3 = ODDLParser::Value::getFloat(this_00);
      __s2 = ODDLParser::Value::getString(pPVar2->m_value);
      iVar1 = strncmp("scale",__s2,5);
      if (iVar1 == 0) {
        this->m_currentLight->mAttenuationQuadratic = fVar3;
      }
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleAttenNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if ( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "curve" );
    if ( nullptr != prop ) {
        if ( nullptr != prop->m_value ) {
            Value *val( node->getValue() );
            const float floatVal( val->getFloat() );
            if ( 0 == strncmp( "scale", prop->m_value->getString(), strlen( "scale" ) ) ) {
                m_currentLight->mAttenuationQuadratic = floatVal;
            }
        }
    }
}